

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O3

void vkt::wsi::createSwapchainTests(TestCaseGroup *testGroup,Type wsiType)

{
  string *psVar1;
  TestNode *pTVar2;
  Function in_R9;
  GroupParameters arg0;
  GroupParameters arg0_00;
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_40._M_allocated_capacity = (size_type)&local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"create","");
  psVar1 = (string *)(local_60 + 0x10);
  local_60._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"Create VkSwapchain with various parameters","");
  arg0.function = in_R9;
  arg0._0_8_ = anon_unknown_0::createSwapchainTest;
  addTestGroup<vkt::wsi::(anonymous_namespace)::GroupParameters>
            (testGroup,(string *)local_40._M_allocated_capacity,(string *)local_60._0_8_,
             (CreateChildrenFunc)(ulong)wsiType,arg0);
  if ((string *)local_60._0_8_ != psVar1) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_allocated_capacity != &local_30) {
    operator_delete((void *)local_40._M_allocated_capacity,local_30._M_allocated_capacity + 1);
  }
  local_40._M_allocated_capacity = (size_type)&local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"simulate_oom","");
  local_60._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"Simulate OOM using callbacks during swapchain construction","");
  arg0_00.function = in_R9;
  arg0_00._0_8_ = anon_unknown_0::createSwapchainSimulateOOMTest;
  addTestGroup<vkt::wsi::(anonymous_namespace)::GroupParameters>
            (testGroup,(string *)local_40._M_allocated_capacity,(string *)local_60._0_8_,
             (CreateChildrenFunc)(ulong)wsiType,arg0_00);
  if ((string *)local_60._0_8_ != psVar1) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_allocated_capacity != &local_30) {
    operator_delete((void *)local_40._M_allocated_capacity,local_30._M_allocated_capacity + 1);
  }
  local_40._M_allocated_capacity = (size_type)&local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"render","");
  local_60._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Rendering Tests","");
  pTVar2 = &createTestGroup<vk::wsi::Type>
                      ((testGroup->super_TestNode).m_testCtx,(string *)&local_40,(string *)local_60,
                       anon_unknown_0::populateRenderGroup,wsiType)->super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  if ((string *)local_60._0_8_ != psVar1) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_allocated_capacity != &local_30) {
    operator_delete((void *)local_40._M_allocated_capacity,local_30._M_allocated_capacity + 1);
  }
  local_40._M_allocated_capacity = (size_type)&local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"modify","");
  local_60._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Modify VkSwapchain","");
  pTVar2 = &createTestGroup<vk::wsi::Type>
                      ((testGroup->super_TestNode).m_testCtx,(string *)&local_40,(string *)local_60,
                       anon_unknown_0::populateModifyGroup,wsiType)->super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  if ((string *)local_60._0_8_ != psVar1) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_allocated_capacity != &local_30) {
    operator_delete((void *)local_40._M_allocated_capacity,local_30._M_allocated_capacity + 1);
  }
  local_40._M_allocated_capacity = (size_type)&local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"destroy","");
  local_60._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Destroy VkSwapchain","");
  pTVar2 = &createTestGroup<vk::wsi::Type>
                      ((testGroup->super_TestNode).m_testCtx,(string *)&local_40,(string *)local_60,
                       anon_unknown_0::populateDestroyGroup,wsiType)->super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  if ((string *)local_60._0_8_ != psVar1) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_allocated_capacity != &local_30) {
    operator_delete((void *)local_40._M_allocated_capacity,local_30._M_allocated_capacity + 1);
  }
  local_40._M_allocated_capacity = (size_type)&local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"get_images","");
  local_60._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Get swapchain images","");
  pTVar2 = &createTestGroup<vk::wsi::Type>
                      ((testGroup->super_TestNode).m_testCtx,(string *)&local_40,(string *)local_60,
                       anon_unknown_0::populateGetImagesGroup,wsiType)->super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  if ((string *)local_60._0_8_ != psVar1) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_allocated_capacity != &local_30) {
    operator_delete((void *)local_40._M_allocated_capacity,local_30._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void createSwapchainTests (tcu::TestCaseGroup* testGroup, vk::wsi::Type wsiType)
{
	addTestGroup(testGroup, "create",			"Create VkSwapchain with various parameters",					populateSwapchainGroup,		GroupParameters(wsiType, createSwapchainTest));
	addTestGroup(testGroup, "simulate_oom",		"Simulate OOM using callbacks during swapchain construction",	populateSwapchainGroup,		GroupParameters(wsiType, createSwapchainSimulateOOMTest));
	addTestGroup(testGroup, "render",			"Rendering Tests",												populateRenderGroup,		wsiType);
	addTestGroup(testGroup, "modify",			"Modify VkSwapchain",											populateModifyGroup,		wsiType);
	addTestGroup(testGroup, "destroy",			"Destroy VkSwapchain",											populateDestroyGroup,		wsiType);
	addTestGroup(testGroup, "get_images",		"Get swapchain images",											populateGetImagesGroup,		wsiType);
}